

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  long lVar1;
  bool bVar2;
  pair<int,_int> *ppVar3;
  long lVar4;
  pair<int,_int> *ppVar5;
  pair<int,_int> *ppVar6;
  ulong uVar7;
  bool bVar8;
  T tmp;
  pair<int,_int> local_50;
  anon_class_8_1_8991fb9c local_48;
  ulong local_40;
  pair<int,_int> *local_38;
  
  if (begin._M_current == end._M_current) {
LAB_00313e06:
    bVar8 = true;
  }
  else {
    uVar7 = 0;
    local_48.this = comp.this;
    local_38 = begin._M_current;
    do {
      ppVar3 = begin._M_current;
      lVar1 = -(long)begin._M_current;
      do {
        lVar4 = lVar1;
        begin._M_current = ppVar3 + 1;
        bVar8 = begin._M_current == end._M_current;
        if (bVar8) goto LAB_00313e06;
        bVar2 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_48,begin._M_current,ppVar3);
        ppVar3 = begin._M_current;
        lVar1 = lVar4 + -8;
      } while (!bVar2);
      local_50 = *begin._M_current;
      local_40 = uVar7;
      do {
        ppVar5 = ppVar3;
        ppVar3 = ppVar5 + -1;
        *ppVar5 = ppVar5[-1];
        ppVar6 = local_38;
        if (ppVar3 == local_38) break;
        bVar2 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_48,&local_50,ppVar5 + -2);
        ppVar6 = ppVar3;
      } while (bVar2);
      ppVar6->first = local_50.first;
      ppVar5[-1].second = local_50.second;
      uVar7 = local_40 + (-((long)&ppVar6[-1].first + lVar4) >> 3);
    } while (uVar7 < 9);
  }
  return bVar8;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }